

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ScaleLayerParams::ScaleLayerParams
          (ScaleLayerParams *this,ScaleLayerParams *from)

{
  bool bVar1;
  WeightParams *pWVar2;
  ScaleLayerParams *from_local;
  ScaleLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ScaleLayerParams_006f4838;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->shapescale_,&from->shapescale_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->shapebias_,&from->shapebias_)
  ;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_scale(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(pWVar2,from->scale_);
    this->scale_ = pWVar2;
  }
  else {
    this->scale_ = (WeightParams *)0x0;
  }
  bVar1 = _internal_has_bias(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(pWVar2,from->bias_);
    this->bias_ = pWVar2;
  }
  else {
    this->bias_ = (WeightParams *)0x0;
  }
  this->hasbias_ = (bool)(from->hasbias_ & 1);
  return;
}

Assistant:

ScaleLayerParams::ScaleLayerParams(const ScaleLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      shapescale_(from.shapescale_),
      shapebias_(from.shapebias_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_scale()) {
    scale_ = new ::CoreML::Specification::WeightParams(*from.scale_);
  } else {
    scale_ = nullptr;
  }
  if (from._internal_has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = nullptr;
  }
  hasbias_ = from.hasbias_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ScaleLayerParams)
}